

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O2

void pkg_deleteList(CharList *l)

{
  _CharList *p_Var1;
  
  while (l != (CharList *)0x0) {
    uprv_free_63(l->str);
    p_Var1 = l->next;
    uprv_free_63(l);
    l = p_Var1;
  }
  return;
}

Assistant:

void pkg_deleteList(CharList *l)
{
  CharList *tmp;
  while(l != NULL)
  {
    uprv_free((void*)l->str);
    tmp = l;
    l = l->next;
    uprv_free(tmp);
  }
}